

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ExtensionSet::Extension::IsInitialized
          (Extension *this,ExtensionSet *ext_set,MessageLite *extendee,int number,Arena *arena)

{
  int iVar1;
  bool bVar2;
  undefined1 uVar3;
  CppType CVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *this_00;
  Nullable<const_char_*> failure_msg;
  LogMessage *pLVar5;
  int i;
  int index;
  string_view v;
  MessageLite *prototype;
  LogMessage local_48;
  MessageLite *local_38;
  
  CVar4 = anon_unknown_59::cpp_type(this->type);
  uVar3 = 1;
  if (CVar4 == CPPTYPE_MESSAGE) {
    if (this->is_repeated == true) {
      index = 0;
      do {
        iVar1 = ((RepeatedPtrFieldBase *)(this->field_0).int64_t_value)->current_size_;
        uVar3 = iVar1 <= index;
        if (iVar1 <= index) {
          return (bool)uVar3;
        }
        this_00 = RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                            ((RepeatedPtrFieldBase *)(this->field_0).int64_t_value,index);
        bVar2 = MessageLite::IsInitialized(this_00);
        index = index + 1;
      } while (bVar2);
    }
    else if ((this->field_0xa & 2) == 0) {
      if ((this->field_0xa & 4) == 0) {
        bVar2 = MessageLite::IsInitialized(this->field_0);
        return bVar2;
      }
      local_38 = GetPrototypeForLazyMessage(ext_set,extendee,number);
      local_48.errno_saver_.saved_errno_ = 0;
      local_48._4_4_ = 0;
      failure_msg = absl::lts_20250127::log_internal::
                    Check_NEImpl<google::protobuf::MessageLite_const*,decltype(nullptr)>
                              (&local_38,(void **)&local_48,"prototype != nullptr");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x69d,failure_msg);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (&local_48,(char (*) [11])"extendee: ");
        v = MessageLite::GetTypeName(extendee);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,v);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar5,(char (*) [11])"; number: ");
        absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,number);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_48);
      }
      uVar3 = (**(code **)(**(long **)&(this->field_0).int32_t_value + 0x50))
                        (*(long **)&(this->field_0).int32_t_value,local_38,arena);
    }
  }
  return (bool)uVar3;
}

Assistant:

bool ExtensionSet::Extension::IsInitialized(const ExtensionSet* ext_set,
                                            const MessageLite* extendee,
                                            int number, Arena* arena) const {
  if (cpp_type(type) != WireFormatLite::CPPTYPE_MESSAGE) return true;

  if (is_repeated) {
    for (int i = 0; i < ptr.repeated_message_value->size(); i++) {
      if (!ptr.repeated_message_value->Get(i).IsInitialized()) {
        return false;
      }
    }
    return true;
  }

  if (is_cleared) return true;

  if (!is_lazy) return ptr.message_value->IsInitialized();

  const MessageLite* prototype =
      ext_set->GetPrototypeForLazyMessage(extendee, number);
  ABSL_DCHECK_NE(prototype, nullptr)
      << "extendee: " << extendee->GetTypeName() << "; number: " << number;
  return ptr.lazymessage_value->IsInitialized(prototype, arena);
}